

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_code.hpp
# Opt level: O2

string_ref * __thiscall
system_error2::status_code<void>::message
          (string_ref *__return_storage_ptr__,status_code<void> *this)

{
  status_code_domain *psVar1;
  size_t sVar2;
  
  psVar1 = this->_domain;
  if (psVar1 == (status_code_domain *)0x0) {
    __return_storage_ptr__->_begin = "(empty)";
    sVar2 = detail::cstrlen("(empty)");
    __return_storage_ptr__->_end = "(empty)" + sVar2;
    __return_storage_ptr__->_state[2] = (void *)0x0;
    __return_storage_ptr__->_state[0] = (void *)0x0;
    __return_storage_ptr__->_state[1] = (void *)0x0;
    __return_storage_ptr__->_thunk = status_code_domain::string_ref::_checking_string_thunk;
  }
  else {
    (*psVar1->_vptr_status_code_domain[5])(__return_storage_ptr__,psVar1,this);
  }
  return __return_storage_ptr__;
}

Assistant:

SYSTEM_ERROR2_CONSTEXPR20 string_ref message() const noexcept
  {
    // Avoid MSVC's buggy ternary operator for expensive to destruct things
    if(_domain != nullptr)
    {
      return _domain->_do_message(*this);
    }
    return string_ref("(empty)");
  }